

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall
kj::(anonymous_namespace)::expectResImpl<kj::String,char>
          (_anonymous_namespace_ *this,EncodingResult<kj::String> *result,
          ArrayPtr<const_char> expected,bool errors)

{
  _anonymous_namespace_ *p_Var1;
  bool *pbVar2;
  bool *pbVar3;
  CappedArray<char,_3UL> CVar4;
  DebugExpression<const_bool_&> _kjCondition;
  unsigned_long i;
  CappedArray<char,_3UL> local_50;
  CappedArray<char,_3UL> local_40;
  
  pbVar2 = (bool *)expected.ptr;
  p_Var1 = this + 0x18;
  if ((int)expected.size_ == 0) {
    _kjCondition.value = (bool *)(CONCAT71(_kjCondition.value._1_7_,*p_Var1) ^ 1);
    if ((*p_Var1 != (_anonymous_namespace_)0x0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x31,ERROR,"\"failed: expected \" \"!result.hadErrors\", _kjCondition",
                 (char (*) [35])"failed: expected !result.hadErrors",
                 (DebugExpression<bool> *)&_kjCondition);
    }
  }
  else if ((*p_Var1 == (_anonymous_namespace_)0x0) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.value = (bool *)p_Var1;
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2f,ERROR,"\"failed: expected \" \"result.hadErrors\", _kjCondition",
               (char (*) [34])"failed: expected result.hadErrors",&_kjCondition);
  }
  _kjCondition.value = (bool *)0x0;
  if (*(long *)(this + 8) != 0) {
    _kjCondition.value = (bool *)(*(long *)(this + 8) - 1);
  }
  if ((_kjCondition.value != pbVar2) && (kj::_::Debug::minSeverity < 3)) {
    local_50.currentSize = (size_t)pbVar2;
    local_40.currentSize = (size_t)_kjCondition.value;
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x34,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", _kjCondition, result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,&local_40.currentSize,
               &local_50.currentSize);
  }
  pbVar3 = (bool *)0x0;
  if (*(long *)(this + 8) != 0) {
    pbVar3 = (bool *)(*(long *)(this + 8) - 1);
  }
  if (pbVar2 <= pbVar3) {
    pbVar3 = pbVar2;
  }
  if (pbVar3 != (bool *)0x0) {
    pbVar2 = (bool *)0x0;
    do {
      _kjCondition.value = pbVar2 + *(long *)this;
      if ((pbVar2[*(long *)this] != pbVar2[(long)&result->super_String]) &&
         (kj::_::Debug::minSeverity < 3)) {
        i = (unsigned_long)pbVar2;
        CVar4 = hex(*_kjCondition.value);
        local_40.currentSize = CVar4.currentSize;
        local_40.content._0_2_ = CVar4.content._0_2_;
        local_40.content[2] = CVar4.content[2];
        CVar4 = hex(*(uchar *)((long)&(result->super_String).content.ptr + i));
        local_50.currentSize = CVar4.currentSize;
        local_50.content._0_2_ = CVar4.content._0_2_;
        local_50.content[2] = CVar4.content[2];
        kj::_::Debug::
        log<char_const(&)[42],kj::_::DebugComparison<char&,char_const&>&,unsigned_long&,kj::CappedArray<char,3ul>,kj::CappedArray<char,3ul>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x36,ERROR,
                   "\"failed: expected \" \"result[i] == expected[i]\", _kjCondition, i, hex(result[i]), hex(expected[i])"
                   ,(char (*) [42])"failed: expected result[i] == expected[i]",
                   (DebugComparison<char_&,_const_char_&> *)&_kjCondition,&i,&local_40,&local_50);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar3 != pbVar2);
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}